

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O1

void __thiscall ScriptException::GetError(ScriptException *this,HRESULT *phr,EXCEPINFO *pei)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  EXCEPINFO *src;
  
  if (phr == (HRESULT *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                       ,0xc9,"(phr)","phr");
    if (!bVar2) goto LAB_00f1b674;
    *puVar3 = 0;
  }
  if (*phr == -0x7999bffc) {
    if (-1 < (this->ei).scode) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                         ,0xcd,"(((HRESULT)(((HRESULT)(ei.scode)))<0))","FAILED(HR(ei.scode))");
      if (!bVar2) {
LAB_00f1b674:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (pei == (EXCEPINFO *)0x0) {
      *phr = (this->ei).scode;
    }
    else {
      src = &this->ei;
      *phr = -0x7ffdfff7;
      js_memcpy_s(pei,0x40,src,0x40);
      (this->ei).pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
      *(undefined8 *)&(this->ei).scode = 0;
      *(undefined8 *)&(this->ei).dwHelpContext = 0;
      (this->ei).pvReserved = (PVOID)0x0;
      (this->ei).bstrDescription = (BSTR)0x0;
      (this->ei).bstrHelpFile = (BSTR)0x0;
      src->wCode = 0;
      src->wReserved = 0;
      *(undefined4 *)&src->field_0x4 = 0;
      (this->ei).bstrSource = (BSTR)0x0;
      if (pei->pfnDeferredFillIn != (_func_HRESULT_tagEXCEPINFO_ptr *)0x0) {
        (*pei->pfnDeferredFillIn)(pei);
        pei->pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
      }
    }
  }
  return;
}

Assistant:

void ScriptException::GetError(HRESULT *phr, EXCEPINFO *pei)
{
    Assert(phr);

    if (HR(SCRIPT_E_RECORDED) == *phr)
    {
        Assert(FAILED(HR(ei.scode)));
        if (nullptr == pei)
            *phr = HR(ei.scode);
        else
        {
            *phr = HR(DISP_E_EXCEPTION);
            js_memcpy_s(pei, sizeof(*pei), &ei, sizeof(*pei));
            memset(&ei, 0, sizeof(ei));
            if (nullptr != pei->pfnDeferredFillIn)
            {
                pei->pfnDeferredFillIn(pei);
                pei->pfnDeferredFillIn = nullptr;
            }
        }
    }
}